

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Hash.cpp
# Opt level: O3

uint16_t axl::sl::checksum16(void *_p,size_t size)

{
  long lVar1;
  int iVar2;
  ushort *puVar3;
  
  puVar3 = (ushort *)((long)_p + (size - 1));
  lVar1 = 0;
  if (_p < puVar3) {
    do {
      lVar1 = lVar1 + (ulong)*_p;
      _p = (void *)((long)_p + 2);
    } while (_p < puVar3);
  }
  if ((size & 1) != 0) {
    lVar1 = lVar1 + (ulong)(byte)*puVar3;
  }
  iVar2 = (int)((ulong)lVar1 >> 0x10) + ((uint)lVar1 & 0xffff);
  return ~((short)((uint)iVar2 >> 0x10) + (short)iVar2);
}

Assistant:

uint16_t
checksum16(
	const void* _p,
	size_t size
) {
	ushort_t* p = (ushort_t*)_p;
	uchar_t* last = (uchar_t*)_p + size - 1;

	uintptr_t sum = 0;

	for (; (uchar_t*)p < last; p++)
		sum += *p;

	if (size & 1)
		sum += *last;

	sum = (sum >> 16) + (sum & 0xffff);
	sum += (sum >> 16);

	return (ushort_t) ~sum;
}